

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O0

size_t __thiscall
google::protobuf::internal::ExtensionSet::SpaceUsedExcludingSelfLong(ExtensionSet *this)

{
  bool bVar1;
  size_type sVar2;
  pointer ppVar3;
  size_t sVar4;
  _Self local_28;
  const_iterator end;
  const_iterator iter;
  size_t total_size;
  ExtensionSet *this_local;
  
  sVar2 = std::
          map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
          ::size(&this->extensions_);
  iter._M_node = (_Base_ptr)(sVar2 << 5);
  end = std::
        map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
        ::begin(&this->extensions_);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
       ::end(&this->extensions_);
  while( true ) {
    bVar1 = std::operator!=(&end,&local_28);
    if (!bVar1) break;
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
             ::operator->(&end);
    sVar4 = Extension::SpaceUsedExcludingSelfLong(&ppVar3->second);
    iter._M_node = (_Base_ptr)((long)&(iter._M_node)->_M_color + sVar4);
    std::
    _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
    ::operator++(&end);
  }
  return (size_t)iter._M_node;
}

Assistant:

size_t ExtensionSet::SpaceUsedExcludingSelfLong() const {
  size_t total_size =
      extensions_.size() * sizeof(ExtensionMap::value_type);
  for (ExtensionMap::const_iterator iter = extensions_.begin(),
       end = extensions_.end();
       iter != end;
       ++iter) {
    total_size += iter->second.SpaceUsedExcludingSelfLong();
  }
  return total_size;
}